

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleset.cpp
# Opt level: O2

int __thiscall Ruleset::getValue(Ruleset *this,Card *c)

{
  CardValue CVar1;
  int iVar2;
  
  CVar1 = Card::value(c);
  iVar2 = 0;
  if (CVar1 - JACK < 5) {
    iVar2 = *(int *)(&DAT_001094c0 + (ulong)(CVar1 - JACK) * 4);
  }
  return iVar2;
}

Assistant:

int Ruleset::getValue(const Card &c) {
    switch(c.value()){
        case CardValue::NINE:
            return 0;
        case CardValue::TEN:
            return 10;
        case CardValue::JACK:
            return 2;
        case CardValue::QUEEN:
            return 3;
        case CardValue::KING:
            return 4;
        case CardValue::ASS:
            return 11;
    }
    return 0;
}